

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBlock
          (AsciiParser *this,Specifier spec,int64_t primIdx,int64_t parentPrimIdx,uint32_t depth,
          bool in_variantStaement)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  map<_40cfd1d7_> *this_00;
  _Rb_tree_header *p_Var2;
  _Base_ptr *pp_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint8_t uVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  ostream *poVar10;
  StreamReader *pSVar11;
  const_iterator cVar12;
  _Any_data *p_Var13;
  long *plVar14;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  size_type *psVar17;
  Specifier s;
  Specifier s_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames_00;
  long lVar18;
  char *pcVar19;
  Path *__args_3;
  Specifier local_534;
  string variantName;
  char local_510;
  string pTy;
  Identifier def;
  char c_1;
  undefined7 uStack_4c7;
  undefined8 uStack_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  _Any_data *local_4a8;
  uint32_t local_49c;
  string prim_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  vmap;
  Identifier prim_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_368;
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [6];
  ios_base local_2f0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  Identifier tok;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> propNames;
  VariantSetList variantSetList;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  props;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
  in_metas;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar6) {
    return false;
  }
  def.super_string._M_dataplus._M_p = (pointer)&def.super_string.field_2;
  def.super_string._M_string_length = 0;
  def.super_string.field_2._M_local_buf[0] = '\0';
  bVar6 = ReadIdentifier(this,&def.super_string);
  if (bVar6) {
    iVar9 = ::std::__cxx11::string::compare((char *)&def);
    if (((iVar9 == 0) || (iVar9 = ::std::__cxx11::string::compare((char *)&def), iVar9 == 0)) ||
       (iVar9 = ::std::__cxx11::string::compare((char *)&def), iVar9 == 0)) {
      iVar9 = ::std::__cxx11::string::compare((char *)&def);
      if (iVar9 == 0) {
        if (spec != Def) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[ASCII]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"ParseBlock",10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
          iVar9 = 0x12db;
          goto LAB_003a75ea;
        }
      }
      else {
        iVar9 = ::std::__cxx11::string::compare((char *)&def);
        if (iVar9 == 0) {
          if (spec != Over) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[ASCII]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"ParseBlock",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
            iVar9 = 0x12e1;
            goto LAB_003a75ea;
          }
        }
        else {
          iVar9 = ::std::__cxx11::string::compare((char *)&def);
          if ((spec != Class) && (iVar9 == 0)) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[ASCII]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"ParseBlock",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
            iVar9 = 0x12e7;
LAB_003a75ea:
            poVar10 = (ostream *)::std::ostream::operator<<((ostream *)&ss_e,iVar9);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,
                       "Internal error. Invalid Specifier token combination. def = ",0x3b);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,def.super_string._M_dataplus._M_p,
                                 def.super_string._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,", spec = ",9);
            tinyusdz::to_string_abi_cxx11_((string *)&vmap,(tinyusdz *)(ulong)spec,s);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)vmap._M_t._M_impl._0_8_,
                                 CONCAT44(vmap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                          vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                                         ));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            pp_Var3 = &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ != pp_Var3) {
              operator_delete((void *)vmap._M_t._M_impl._0_8_,
                              (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            ::std::__cxx11::stringbuf::str();
            PushError(this,(string *)&vmap);
            if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ != pp_Var3) goto LAB_003a76c0;
            goto LAB_003a76d0;
          }
        }
      }
      bVar6 = SkipWhitespaceAndNewline(this,true);
      if (bVar6) {
        pSVar11 = this->_sr;
        uVar15 = pSVar11->idx_;
        if (uVar15 + 1 <= pSVar11->length_) {
          uVar5 = pSVar11->binary_[uVar15];
          pSVar11->idx_ = uVar15 + 1;
          if (uVar15 <= pSVar11->length_ && -1 < (long)uVar15) {
            pSVar11->idx_ = uVar15;
            prim_type.super_string._M_dataplus._M_p = (pointer)&prim_type.super_string.field_2;
            prim_type.super_string._M_string_length = 0;
            prim_type.super_string.field_2._M_local_buf[0] = '\0';
            if (((uVar5 == '\"') || (bVar6 = ReadIdentifier(this,&prim_type.super_string), bVar6))
               && (bVar6 = SkipWhitespaceAndNewline(this,true), bVar6)) {
              prim_name._M_dataplus._M_p = (pointer)&prim_name.field_2;
              prim_name._M_string_length = 0;
              prim_name.field_2._M_local_buf[0] = '\0';
              bVar6 = ReadBasicType(this,&prim_name);
              if (bVar6) {
                bVar6 = ValidatePrimElementName(&prim_name);
                if (!bVar6) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[ASCII]",7)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"ParseBlock",10);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                  poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x1318);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss_e,"Prim name contains invalid chacracter.",0x26);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(this,(string *)&vmap);
                  if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                      &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                    (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                    _M_header._M_parent)->_M_color + 1));
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  ::std::ios_base::~ios_base(local_2f0);
                  goto LAB_003a7862;
                }
                bVar6 = SkipWhitespaceAndNewline(this,true);
                if (!bVar6) goto LAB_003a7862;
                in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &in_metas._M_t._M_impl.super__Rb_tree_header._M_header;
                in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                in_metas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                bVar6 = LookChar1(this,(char *)&ss_e);
                if (((bVar6) &&
                    (((ss_e != (ostringstream)0x28 ||
                      ((bVar6 = ParsePrimMetas(this,&in_metas), bVar6 &&
                       (bVar6 = SkipWhitespaceAndNewline(this,true), bVar6)))) &&
                     (bVar6 = SkipCommentAndWhitespaceAndNewline(this,true), bVar6)))) &&
                   (bVar6 = Expect(this,'{'), bVar6)) {
                  bVar7 = SkipWhitespaceAndNewline(this,true);
                  bVar6 = false;
                  if (bVar7) {
                    props._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         &props._M_t._M_impl.super__Rb_tree_header._M_header;
                    props._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                    props._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                    propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                         &variantSetList._M_t._M_impl.super__Rb_tree_header._M_header;
                    variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)0x0;
                    variantSetList._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                    variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                         variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    props._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                         props._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
                    iVar9 = ::std::__cxx11::string::compare((char *)&ss_e);
                    if (iVar9 == 0) {
                      ::std::__cxx11::string::_M_append
                                ((char *)&ss_e,(ulong)prim_name._M_dataplus._M_p);
                    }
                    else {
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&vmap,"/",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&prim_name);
                      ::std::__cxx11::string::_M_append((char *)&ss_e,vmap._M_t._M_impl._0_8_);
                      if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                          &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                        operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                        (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                        _M_header._M_parent)->_M_color + 1));
                      }
                    }
                    local_368 = &this->_path_stack;
                    ::std::
                    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&local_368->c,(value_type *)&ss_e);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_ss_e != local_350) {
                      operator_delete(_ss_e,local_350[0]._M_allocated_capacity + 1);
                    }
                    pSVar11 = this->_sr;
                    pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pSVar11->idx_;
                    if (pbVar16 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pSVar11->length_) {
                      local_4a8 = (_Any_data *)&this->_prim_idx_assign_fun;
                      local_49c = depth + 1;
                      do {
                        if (*(uint8_t *)
                             ((long)&(pbVar16->_M_dataplus)._M_p + (long)pSVar11->binary_) == '\0')
                        break;
                        bVar6 = SkipCommentAndWhitespaceAndNewline(this,true);
                        if (!bVar6) {
LAB_003a8781:
                          bVar6 = false;
                          goto LAB_003a8eff;
                        }
                        pSVar11 = this->_sr;
                        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pSVar11->idx_;
                        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&(pbVar16->_M_dataplus)._M_p + 1);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pSVar11->length_ < pbVar1) goto LAB_003a8781;
                        uVar5 = *(uint8_t *)
                                 ((long)&(pbVar16->_M_dataplus)._M_p + (long)pSVar11->binary_);
                        c_1 = uVar5;
                        pSVar11->idx_ = (uint64_t)pbVar1;
                        if (uVar5 == '}') break;
                        if (((long)pbVar16 < 0) ||
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pSVar11->length_ < pbVar16)) goto LAB_003a8781;
                        pSVar11->idx_ = (uint64_t)pbVar16;
                        tok.super_string._M_dataplus._M_p = (pointer)&tok.super_string.field_2;
                        tok.super_string._M_string_length = 0;
                        tok.super_string.field_2._M_local_buf[0] = '\0';
                        bVar6 = ReadBasicType(this,&tok);
                        if (bVar6) {
                          iVar9 = ::std::__cxx11::string::compare((char *)&tok);
                          if (iVar9 == 0) {
                            bVar6 = SkipWhitespace(this);
                            cVar8 = '\x01';
                            if (bVar6) {
                              variantName._M_dataplus._M_p = (pointer)&variantName.field_2;
                              variantName._M_string_length = 0;
                              variantName.field_2._M_local_buf[0] = '\0';
                              bVar6 = ReadBasicType(this,&variantName);
                              if (bVar6) {
                                bVar6 = SkipWhitespace(this);
                                cVar8 = '\x01';
                                if (((bVar6) && (bVar6 = Expect(this,'='), bVar6)) &&
                                   (bVar6 = SkipWhitespace(this), bVar6)) {
                                  vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                       _S_red;
                                  vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                       (_Base_ptr)0x0;
                                  vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                       &vmap._M_t._M_impl.super__Rb_tree_header._M_header;
                                  vmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                                  vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                                       vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                                  bVar6 = ParseVariantSet(this,primIdx,parentPrimIdx,depth,&vmap);
                                  if (bVar6) {
                                    ::std::
                                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>
                                    ::
                                    _M_emplace_unique<std::__cxx11::string&,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>&>
                                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>
                                                *)&variantSetList,&variantName,&vmap);
                                    cVar8 = '\f';
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&ss_e);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"ParseBlock",10);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"():",3);
                                    poVar10 = (ostream *)
                                              ::std::ostream::operator<<
                                                        ((ostringstream *)&ss_e,0x138e);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10," ",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,
                                               "Failed to parse `variantSet` statement.",0x27);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"\n",1);
                                    ::std::__cxx11::stringbuf::str();
                                    PushError(this,&pTy);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)pTy._M_dataplus._M_p != &pTy.field_2) {
                                      operator_delete(pTy._M_dataplus._M_p,
                                                      pTy.field_2._M_allocated_capacity + 1);
                                    }
                                    ::std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)&ss_e);
                                    ::std::ios_base::~ios_base(local_2f0);
                                    cVar8 = '\x01';
                                  }
                                  ::std::
                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                                  ::_M_erase(&vmap._M_t,
                                             (_Link_type)
                                             vmap._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent);
                                }
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e)
                                ;
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                           ,0x56);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"ParseBlock",10);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"():",3);
                                poVar10 = (ostream *)
                                          ::std::ostream::operator<<((ostringstream *)&ss_e,0x137b);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,
                                           "Failed to parse `variantSet` statement.",0x27);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"\n",1);
                                ::std::__cxx11::stringbuf::str();
                                PushError(this,(string *)&vmap);
                                if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                                    &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                                  operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                                  (ulong)((long)&(vmap._M_t._M_impl.
                                                                  super__Rb_tree_header._M_header.
                                                                 _M_parent)->_M_color + 1));
                                }
                                ::std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)&ss_e);
                                ::std::ios_base::~ios_base(local_2f0);
                                cVar8 = '\x01';
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)variantName._M_dataplus._M_p != &variantName.field_2) {
                                operator_delete(variantName._M_dataplus._M_p,
                                                CONCAT71(variantName.field_2._M_allocated_capacity.
                                                         _1_7_,variantName.field_2._M_local_buf[0])
                                                + 1);
                              }
                            }
                          }
                          else {
                            pSVar11 = this->_sr;
                            uVar15 = pSVar11->idx_ - tok.super_string._M_string_length;
                            cVar8 = '\x01';
                            if ((-1 < (long)uVar15) && (uVar15 <= pSVar11->length_)) {
                              pSVar11->idx_ = uVar15;
                              iVar9 = ::std::__cxx11::string::compare((char *)&tok);
                              if (iVar9 == 0) {
                                local_534 = Def;
LAB_003a7ff7:
                                _ss_e = (pointer)parentPrimIdx;
                                if ((this->_prim_idx_assign_fun).super__Function_base._M_manager ==
                                    (_Manager_type)0x0) {
                                  ::std::__throw_bad_function_call();
                                }
                                lVar18 = (*(this->_prim_idx_assign_fun)._M_invoker)
                                                   (local_4a8,(long *)&ss_e);
                                pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)primIdx;
                                bVar6 = ParseBlock(this,local_534,lVar18,primIdx,local_49c,false);
                                if (!bVar6) {
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)&ss_e);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,"[error]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                             ,0x56);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,"ParseBlock",10);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,"():",3);
                                  poVar10 = (ostream *)::std::ostream::operator<<(&ss_e,0x13ab);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar10," ",1);
                                  variantName._M_dataplus._M_p = (pointer)&variantName.field_2;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&variantName,"`{}` block parse failed.","");
                                  tinyusdz::to_string_abi_cxx11_
                                            (&pTy,(tinyusdz *)(ulong)local_534,s_00);
                                  fmt::format<std::__cxx11::string>
                                            ((string *)&vmap,(fmt *)&variantName,(string *)&pTy,
                                             pbVar16);
                                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&ss_e,
                                                       (char *)vmap._M_t._M_impl._0_8_,
                                                       CONCAT44(vmap._M_t._M_impl.
                                                                super__Rb_tree_header._M_header.
                                                                _4_4_,vmap._M_t._M_impl.
                                                                      super__Rb_tree_header.
                                                                      _M_header._M_color));
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar10,"\n",1);
                                  if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                                      &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                  {
                                    operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                                    (ulong)((long)&(vmap._M_t._M_impl.
                                                                    super__Rb_tree_header._M_header.
                                                                   _M_parent)->_M_color + 1));
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)pTy._M_dataplus._M_p != &pTy.field_2) {
                                    operator_delete(pTy._M_dataplus._M_p,
                                                    pTy.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)variantName._M_dataplus._M_p != &variantName.field_2) {
                                    operator_delete(variantName._M_dataplus._M_p,
                                                    CONCAT71(variantName.field_2.
                                                             _M_allocated_capacity._1_7_,
                                                             variantName.field_2._M_local_buf[0]) +
                                                    1);
                                  }
                                  ::std::__cxx11::stringbuf::str();
                                  PushError(this,(string *)&vmap);
                                  if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                                      &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                  {
                                    operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                                    (ulong)((long)&(vmap._M_t._M_impl.
                                                                    super__Rb_tree_header._M_header.
                                                                   _M_parent)->_M_color + 1));
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)&ss_e);
                                  ::std::ios_base::~ios_base(local_2f0);
                                  goto LAB_003a7d48;
                                }
                              }
                              else {
                                iVar9 = ::std::__cxx11::string::compare((char *)&tok);
                                if (iVar9 == 0) {
                                  local_534 = Over;
                                  goto LAB_003a7ff7;
                                }
                                iVar9 = ::std::__cxx11::string::compare((char *)&tok);
                                if (iVar9 == 0) {
                                  local_534 = Class;
                                  goto LAB_003a7ff7;
                                }
                                bVar6 = ParsePrimProps(this,&props,propNames_00);
                                if (!bVar6) {
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)&ss_e);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,"[error]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                             ,0x56);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,"ParseBlock",10);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,"():",3);
                                  poVar10 = (ostream *)
                                            ::std::ostream::operator<<
                                                      ((ostringstream *)&ss_e,0x13b2);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar10," ",1);
                                  lVar18 = 0x1f;
                                  pcVar19 = "Failed to parse Prim attribute.";
                                  goto LAB_003a7cc0;
                                }
                              }
                              bVar6 = SkipWhitespaceAndNewline(this,true);
                              cVar8 = !bVar6;
                            }
                          }
                        }
                        else {
                          bVar6 = LookChar1(this,&c_1);
                          if ((bVar6) && (c_1 == ';')) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                       ,0x56);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,"ParseBlock",10);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,"():",3);
                            poVar10 = (ostream *)
                                      ::std::ostream::operator<<((ostringstream *)&ss_e,0x136d);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                            lVar18 = 0x31;
                            pcVar19 = "Semicolon is not allowd in `def` block statement.";
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                       ,0x56);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,"ParseBlock",10);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&ss_e,"():",3);
                            poVar10 = (ostream *)
                                      ::std::ostream::operator<<((ostringstream *)&ss_e,0x1371);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                            lVar18 = 0x37;
                            pcVar19 = "Failed to parse an identifier in `def` block statement.";
                          }
LAB_003a7cc0:
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&ss_e,pcVar19,lVar18);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&ss_e,"\n",1);
                          ::std::__cxx11::stringbuf::str();
                          PushError(this,(string *)&vmap);
                          if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                              &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                            operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                            (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                            _M_header._M_parent)->_M_color + 1));
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                          ::std::ios_base::~ios_base(local_2f0);
                          cVar8 = '\x01';
                        }
LAB_003a7d48:
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)tok.super_string._M_dataplus._M_p != &tok.super_string.field_2) {
                          operator_delete(tok.super_string._M_dataplus._M_p,
                                          CONCAT71(tok.super_string.field_2._M_allocated_capacity.
                                                   _1_7_,tok.super_string.field_2._M_local_buf[0]) +
                                          1);
                        }
                        if ((cVar8 != '\f') && (cVar8 != '\0')) goto LAB_003a8781;
                        pSVar11 = this->_sr;
                        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pSVar11->idx_;
                      } while (pbVar16 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pSVar11->length_);
                    }
                    pTy._M_dataplus._M_p = (pointer)&pTy.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&pTy,prim_type.super_string._M_dataplus._M_p,
                               prim_type.super_string._M_dataplus._M_p +
                               prim_type.super_string._M_string_length);
                    if (this->_primspec_mode == true) {
                      if ((this->_primspec_fun).super__Function_base._M_manager ==
                          (_Manager_type)0x0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"[ASCII]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1)
                        ;
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"ParseBlock",10);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"():",3);
                        poVar10 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)&ss_e,0x13d1);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,
                                   "[Internal Error] PrimSpec handler is not found.",0x2f);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"\n",1);
                        ::std::__cxx11::stringbuf::str();
                        PushError(this,(string *)&vmap);
                        if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                            &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                          operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                          (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                          _M_header._M_parent)->_M_color + 1));
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                        ::std::ios_base::~ios_base(local_2f0);
                      }
                      else {
                        GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
                        tok.super_string._M_dataplus._M_p = (pointer)&tok.super_string.field_2;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&tok.super_string,"");
                        Path::Path((Path *)&vmap,(string *)&ss_e,&tok.super_string);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)tok.super_string._M_dataplus._M_p != &tok.super_string.field_2) {
                          operator_delete(tok.super_string._M_dataplus._M_p,
                                          CONCAT71(tok.super_string.field_2._M_allocated_capacity.
                                                   _1_7_,tok.super_string.field_2._M_local_buf[0]) +
                                          1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_ss_e != local_350) {
                          operator_delete(_ss_e,local_350[0]._M_allocated_capacity + 1);
                        }
                        local_4a8 = (_Any_data *)&this->_primspec_fun;
                        _ss_e = (pointer)local_350;
                        ::std::__cxx11::string::_M_construct<char_const*>((string *)&ss_e,"");
                        Path::Path((Path *)&tok,&prim_name,(string *)&ss_e);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_ss_e != local_350) {
                          operator_delete(_ss_e,local_350[0]._M_allocated_capacity + 1);
                        }
                        __args_3 = (Path *)&tok;
                        ::std::function<$3792144$>::operator()
                                  ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&variantName,(function<_3792144_> *)local_4a8,(Path *)&vmap,
                                   spec,&prim_type.super_string,__args_3,primIdx,parentPrimIdx,
                                   &props,&in_metas,&variantSetList);
                        if (local_510 != '\0') {
                          Path::~Path((Path *)&tok);
                          Path::~Path((Path *)&vmap);
                          goto LAB_003a8a59;
                        }
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1)
                        ;
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"ParseBlock",10);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"():",3);
                        poVar10 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)&ss_e,0x13cd);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_388,
                                   "Constructing PrimSpec typeName `{}`, elementName `{}` failed: {}"
                                   ,"");
                        fmt::
                        format<tinyusdz::ascii::Identifier,std::__cxx11::string,std::__cxx11::string>
                                  ((string *)&c_1,(fmt *)&local_388,&prim_type.super_string,
                                   (Identifier *)&prim_name,&variantName,&__args_3->_prim_part);
                        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,(char *)_c_1,uStack_4c0);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_c_1 != &local_4b8) {
                          operator_delete((void *)_c_1,(ulong)(local_4b8._M_allocated_capacity + 1))
                          ;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_388._M_dataplus._M_p != &local_388.field_2) {
                          operator_delete(local_388._M_dataplus._M_p,
                                          local_388.field_2._M_allocated_capacity + 1);
                        }
                        ::std::__cxx11::stringbuf::str();
                        PushError(this,(string *)&c_1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_c_1 != &local_4b8) {
                          operator_delete((void *)_c_1,(ulong)(local_4b8._M_allocated_capacity + 1))
                          ;
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                        ::std::ios_base::~ios_base(local_2f0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)variantName._M_dataplus._M_p != &variantName.field_2) {
                          operator_delete(variantName._M_dataplus._M_p,
                                          CONCAT71(variantName.field_2._M_allocated_capacity._1_7_,
                                                   variantName.field_2._M_local_buf[0]) + 1);
                        }
                        Path::~Path((Path *)&tok);
                        Path::~Path((Path *)&vmap);
                      }
LAB_003a8ee0:
                      bVar6 = false;
                    }
                    else {
                      if (prim_type.super_string._M_string_length == 0) {
                        ::std::__cxx11::string::operator=((string *)&pTy,"Model");
                      }
                      this_00 = &this->_prim_construct_fun_map;
                      cVar12 = ::std::_Rb_tree<$d8d97b32$>::find(&this_00->_M_t,&pTy);
                      p_Var2 = &(this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header;
                      if (((_Rb_tree_header *)cVar12._M_node == p_Var2) &&
                         ((this->_option).allow_unknown_prim == true)) {
                        ::std::__cxx11::string::operator=((string *)&pTy,"Model");
                      }
                      cVar12 = ::std::_Rb_tree<$d8d97b32$>::find(&this_00->_M_t,&pTy);
                      if ((_Rb_tree_header *)cVar12._M_node == p_Var2) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"[warn]",6);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1)
                        ;
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"ParseBlock",10);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"():",3);
                        poVar10 = (ostream *)
                                  ::std::ostream::operator<<((ostringstream *)&ss_e,0x13f7);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                        paVar4 = &tok.super_string.field_2;
                        tok.super_string._M_dataplus._M_p = (pointer)paVar4;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&tok,
                                   "TODO: Unsupported/Unimplemented Prim type: `{}`. Skipping parsing."
                                   ,"");
                        fmt::format<std::__cxx11::string>
                                  ((string *)&vmap,(fmt *)&tok,(string *)&pTy,pbVar16);
                        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&ss_e,(char *)vmap._M_t._M_impl._0_8_,
                                             CONCAT44(vmap._M_t._M_impl.super__Rb_tree_header.
                                                      _M_header._4_4_,
                                                      vmap._M_t._M_impl.super__Rb_tree_header.
                                                      _M_header._M_color));
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                        pp_Var3 = &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                        if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ != pp_Var3) {
                          operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                          (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                          _M_header._M_parent)->_M_color + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)tok.super_string._M_dataplus._M_p != paVar4) {
                          operator_delete(tok.super_string._M_dataplus._M_p,
                                          CONCAT71(tok.super_string.field_2._M_allocated_capacity.
                                                   _1_7_,tok.super_string.field_2._M_local_buf[0]) +
                                          1);
                        }
                        ::std::__cxx11::stringbuf::str();
                        PushWarn(this,(string *)&vmap);
                        if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ != pp_Var3) {
                          operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                          (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                          _M_header._M_parent)->_M_color + 1));
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                        ::std::ios_base::~ios_base(local_2f0);
                      }
                      else {
                        p_Var13 = (_Any_data *)::std::map<$40cfd1d7$>::operator[](this_00,&pTy);
                        _c_1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x0;
                        uStack_4c0 = 0;
                        local_4b8._M_allocated_capacity = 0;
                        local_4b8._8_8_ = (_Invoker_type)0x0;
                        if (*(code **)(p_Var13 + 1) != (code *)0x0) {
                          (**(code **)(p_Var13 + 1))((_Any_data *)&c_1,p_Var13,__clone_functor);
                          local_4b8._M_allocated_capacity = *(undefined8 *)(p_Var13 + 1);
                          local_4b8._8_8_ = *(undefined8 *)(p_Var13->_M_pod_data + 0x18);
                        }
                        GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
                        tok.super_string._M_dataplus._M_p = (pointer)&tok.super_string.field_2;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&tok.super_string,"");
                        Path::Path((Path *)&vmap,(string *)&ss_e,&tok.super_string);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)tok.super_string._M_dataplus._M_p != &tok.super_string.field_2) {
                          operator_delete(tok.super_string._M_dataplus._M_p,
                                          CONCAT71(tok.super_string.field_2._M_allocated_capacity.
                                                   _1_7_,tok.super_string.field_2._M_local_buf[0]) +
                                          1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_ss_e != local_350) {
                          operator_delete(_ss_e,local_350[0]._M_allocated_capacity + 1);
                        }
                        _ss_e = (pointer)local_350;
                        ::std::__cxx11::string::_M_construct<char_const*>((string *)&ss_e,"");
                        Path::Path((Path *)&tok,&prim_name,(string *)&ss_e);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_ss_e != local_350) {
                          operator_delete(_ss_e,local_350[0]._M_allocated_capacity + 1);
                        }
                        ::std::function<$3792144$>::operator()
                                  ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&variantName,(function<_3792144_> *)&c_1,(Path *)&vmap,spec,
                                   &prim_type.super_string,(Path *)&tok,primIdx,parentPrimIdx,&props
                                   ,&in_metas,&variantSetList);
                        if (local_510 == '\0') {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&ss_e,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&ss_e,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                     ,0x56);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&ss_e,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&ss_e,"ParseBlock",10);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&ss_e,"():",3);
                          poVar10 = (ostream *)
                                    ::std::ostream::operator<<((ostringstream *)&ss_e,0x13f1);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                          ::std::operator+(&local_50,"Constructing Prim type `",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&pTy);
                          plVar14 = (long *)::std::__cxx11::string::append((char *)&local_50);
                          psVar17 = (size_type *)(plVar14 + 2);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*plVar14 ==
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)psVar17) {
                            local_1e8.field_2._M_allocated_capacity = *psVar17;
                            local_1e8.field_2._8_8_ = plVar14[3];
                            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                          }
                          else {
                            local_1e8.field_2._M_allocated_capacity = *psVar17;
                            local_1e8._M_dataplus._M_p = (pointer)*plVar14;
                          }
                          local_1e8._M_string_length = plVar14[1];
                          *plVar14 = (long)psVar17;
                          plVar14[1] = 0;
                          *(undefined1 *)(plVar14 + 2) = 0;
                          ::std::operator+(&local_388,&local_1e8,&variantName);
                          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,local_388._M_dataplus._M_p,
                                               local_388._M_string_length);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_388._M_dataplus._M_p != &local_388.field_2) {
                            operator_delete(local_388._M_dataplus._M_p,
                                            local_388.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                            operator_delete(local_1e8._M_dataplus._M_p,
                                            local_1e8.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_50._M_dataplus._M_p != &local_50.field_2) {
                            operator_delete(local_50._M_dataplus._M_p,
                                            local_50.field_2._M_allocated_capacity + 1);
                          }
                          ::std::__cxx11::stringbuf::str();
                          PushError(this,&local_388);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_388._M_dataplus._M_p != &local_388.field_2) {
                            operator_delete(local_388._M_dataplus._M_p,
                                            local_388.field_2._M_allocated_capacity + 1);
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                          ::std::ios_base::~ios_base(local_2f0);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)variantName._M_dataplus._M_p != &variantName.field_2) {
                            operator_delete(variantName._M_dataplus._M_p,
                                            CONCAT71(variantName.field_2._M_allocated_capacity._1_7_
                                                     ,variantName.field_2._M_local_buf[0]) + 1);
                          }
                          Path::~Path((Path *)&tok);
                          Path::~Path((Path *)&vmap);
                          if ((_Manager_type)local_4b8._M_allocated_capacity != (_Manager_type)0x0)
                          {
                            (*(code *)local_4b8._M_allocated_capacity)(&c_1,&c_1,3);
                          }
                          goto LAB_003a8ee0;
                        }
                        Path::~Path((Path *)&tok);
                        Path::~Path((Path *)&vmap);
                        if ((_Manager_type)local_4b8._M_allocated_capacity != (_Manager_type)0x0) {
                          (*(code *)local_4b8._M_allocated_capacity)(&c_1,&c_1,3);
                        }
                      }
LAB_003a8a59:
                      bVar6 = true;
                      if ((this->_path_stack).c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                          (this->_path_stack).c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                        ::std::
                        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::pop_back(&local_368->c);
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pTy._M_dataplus._M_p != &pTy.field_2) {
                      operator_delete(pTy._M_dataplus._M_p,pTy.field_2._M_allocated_capacity + 1);
                    }
LAB_003a8eff:
                    ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
                    ::_M_erase(&variantSetList._M_t,
                               (_Link_type)
                               variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                              );
                    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                              (&propNames);
                    ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                *)&props,
                               (_Link_type)
                               props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                  }
                }
                else {
                  bVar6 = false;
                }
                ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                ::_M_erase(&in_metas._M_t,
                           (_Link_type)
                           in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
              }
              else {
LAB_003a7862:
                bVar6 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)prim_name._M_dataplus._M_p != &prim_name.field_2) {
                operator_delete(prim_name._M_dataplus._M_p,
                                CONCAT71(prim_name.field_2._M_allocated_capacity._1_7_,
                                         prim_name.field_2._M_local_buf[0]) + 1);
              }
            }
            else {
              bVar6 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)prim_type.super_string._M_dataplus._M_p != &prim_type.super_string.field_2) {
              operator_delete(prim_type.super_string._M_dataplus._M_p,
                              CONCAT71(prim_type.super_string.field_2._M_allocated_capacity._1_7_,
                                       prim_type.super_string.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_003a76f4;
          }
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ss_e,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"ParseBlock",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x12d3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ss_e,"Invalid specifier.",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&vmap);
      if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
          &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
LAB_003a76c0:
        operator_delete((void *)vmap._M_t._M_impl._0_8_,
                        (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
LAB_003a76d0:
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      ::std::ios_base::~ios_base(local_2f0);
    }
  }
  bVar6 = false;
LAB_003a76f4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)def.super_string._M_dataplus._M_p != &def.super_string.field_2) {
    operator_delete(def.super_string._M_dataplus._M_p,
                    CONCAT71(def.super_string.field_2._M_allocated_capacity._1_7_,
                             def.super_string.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool AsciiParser::ParseBlock(const Specifier spec, const int64_t primIdx,
                             const int64_t parentPrimIdx, const uint32_t depth,
                             const bool in_variantStaement) {
  (void)in_variantStaement;

  DCOUT("ParseBlock");

  if (!SkipCommentAndWhitespaceAndNewline()) {
    DCOUT("SkipCommentAndWhitespaceAndNewline failed");
    return false;
  }

  Identifier def;
  if (!ReadIdentifier(&def)) {
    DCOUT("ReadIdentifier failed");
    return false;
  }
  DCOUT("spec = " << def);

  if ((def == "def") || (def == "over") || (def == "class")) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN("Invalid specifier.");
  }

  // Ensure spec and def is same.
  if (def == "def") {
    if (spec != Specifier::Def) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  } else if (def == "over") {
    if (spec != Specifier::Over) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  } else if (def == "class") {
    if (spec != Specifier::Class) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  // look ahead
  bool has_primtype = false;
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (!Rewind(1)) {
      return false;
    }

    if (c == '"') {
      // token
      has_primtype = false;
    } else {
      has_primtype = true;
    }
  }

  Identifier prim_type;

  DCOUT("has_primtype = " << has_primtype);

  if (has_primtype) {
    if (!ReadIdentifier(&prim_type)) {
      return false;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::string prim_name;
  if (!ReadBasicType(&prim_name)) {
    return false;
  }

  DCOUT("prim name = " << prim_name);
  if (!ValidatePrimElementName(prim_name)) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Prim name contains invalid chacracter.");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, std::pair<ListEditQual, MetaVariable>> in_metas;
  {
    // look ahead
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      // meta

      if (!ParsePrimMetas(&in_metas)) {
        DCOUT("Parse Prim metas failed.");
        return false;
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, Property> props;
  std::vector<value::token> propNames;
  VariantSetList variantSetList;

  {
    std::string full_path = GetCurrentPrimPath();
    if (full_path == "/") {
      full_path += prim_name;
    } else {
      full_path += "/" + prim_name;
    }
    PushPrimPath(full_path);
  }

  // expect = '}'
  //        | def_block
  //        | prim_attr+
  //        | variantSet '{' ... '}'
  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      // end block
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      DCOUT("Read stmt token");
      Identifier tok;
      if (!ReadBasicType(&tok)) {
        // maybe ';'?

        if (LookChar1(&c)) {
          if (c == ';') {
            PUSH_ERROR_AND_RETURN(
                "Semicolon is not allowd in `def` block statement.");
          }
        }
        PUSH_ERROR_AND_RETURN(
            "Failed to parse an identifier in `def` block statement.");
      }

      if (tok == "variantSet") {
        if (!SkipWhitespace()) {
          return false;
        }

        std::string variantName;
        if (!ReadBasicType(&variantName)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `variantSet` statement.");
        }

        DCOUT("variantName = " << variantName);

        if (!SkipWhitespace()) {
          return false;
        }

        if (!Expect('=')) {
          return false;
        }

        if (!SkipWhitespace()) {
          return false;
        }

        std::map<std::string, VariantContent> vmap;
        if (!ParseVariantSet(primIdx, parentPrimIdx, depth, &vmap)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `variantSet` statement.");
        }

        variantSetList.emplace(variantName, vmap);

        continue;
      }

      if (!Rewind(tok.size())) {
        return false;
      }

      Specifier child_spec{Specifier::Invalid};
      if (tok == "def") {
        child_spec = Specifier::Def;
      } else if (tok == "over") {
        child_spec = Specifier::Over;
      } else if (tok == "class") {
        child_spec = Specifier::Class;
      }

      if (child_spec != Specifier::Invalid) {
        int64_t idx = _prim_idx_assign_fun(parentPrimIdx);
        DCOUT("enter parseDef. spec = " << to_string(child_spec) << ", idx = "
                                        << idx << ", rootIdx = " << primIdx);

        // recusive call
        if (!ParseBlock(child_spec, idx, primIdx, depth + 1)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("`{}` block parse failed.", to_string(child_spec)));
        }
        DCOUT(fmt::format("Done parse `{}` block.", to_string(child_spec)));
      } else {
        DCOUT("Enter ParsePrimProps.");
        // Assume PrimAttr
        if (!ParsePrimProps(&props, &propNames)) {
          PUSH_ERROR_AND_RETURN("Failed to parse Prim attribute.");
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  std::string pTy = prim_type;

  if (_primspec_mode) {
    // Load scene as PrimSpec tree
    if (_primspec_fun) {
      Path fullpath(GetCurrentPrimPath(), "");
      Path pname(prim_name, "");

      // pass prim_type as is(empty = empty string)
      nonstd::expected<bool, std::string> ret =
          _primspec_fun(fullpath, spec, prim_type, pname, primIdx,
                        parentPrimIdx, props, in_metas, variantSetList);

      if (!ret) {
        // construction failed.
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Constructing PrimSpec typeName `{}`, elementName `{}` failed: {}",
            prim_type, prim_name, ret.error()));
      }
    } else {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "[Internal Error] PrimSpec handler is not found.");
    }

  } else {
    // Create typed Prim.

    if (prim_type.empty()) {
      // No Prim type specified. Treat it as Model

      pTy = "Model";
    }

    if (!_prim_construct_fun_map.count(pTy)) {
      if (_option.allow_unknown_prim) {
        // Unknown Prim type specified. Treat it as Model
        // Prim's type name will be storead in Model::prim_type_name
        pTy = "Model";
      }
    }

    if (_prim_construct_fun_map.count(pTy)) {
      auto construct_fun = _prim_construct_fun_map[pTy];

      Path fullpath(GetCurrentPrimPath(), "");
      Path pname(prim_name, "");
      nonstd::expected<bool, std::string> ret =
          construct_fun(fullpath, spec, prim_type, pname, primIdx,
                        parentPrimIdx, props, in_metas, variantSetList);

      if (!ret) {
        // construction failed.
        PUSH_ERROR_AND_RETURN("Constructing Prim type `" + pTy +
                              "` failed: " + ret.error());
      }

    } else {
      PUSH_WARN(fmt::format(
          "TODO: Unsupported/Unimplemented Prim type: `{}`. Skipping parsing.",
          pTy));
    }
  }

  PopPrimPath();

  return true;
}